

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.h
# Opt level: O1

void __thiscall winmd::reader::database::initialize(database *this)

{
  table<winmd::reader::TypeDef> *this_00;
  file_view *this_01;
  table<winmd::reader::MethodDef> *this_02;
  table<winmd::reader::Module> *this_03;
  table<winmd::reader::Assembly> *this_04;
  table<winmd::reader::AssemblyRef> *this_05;
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  short *psVar8;
  uint8_t *puVar9;
  byte bVar10;
  char cVar11;
  char cVar12;
  table_base *ptVar13;
  table_base *ptVar14;
  uint8_t uVar15;
  bool bVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  byte bVar20;
  int *piVar21;
  image_section_header *piVar22;
  size_t sVar23;
  uint32_t *puVar24;
  uint8_t uVar25;
  uint8_t uVar26;
  uint8_t uVar27;
  uint8_t uVar28;
  uint8_t uVar29;
  uint8_t uVar30;
  byte bVar31;
  short sVar32;
  uint uVar33;
  uint8_t *puVar34;
  ulong uVar35;
  uint8_t uVar36;
  uint8_t c;
  byte bVar37;
  uint8_t d;
  byte bVar38;
  int iVar39;
  int iVar40;
  size_type __rlen;
  ulong uVar41;
  uint8_t uVar42;
  image_section_header *piVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  string f;
  _Alloc_hider in_stack_fffffffffffffe10;
  byte_view local_178;
  array<char,_12UL> name;
  byte_view tables;
  
  this_01 = &this->m_view;
  byte_view::check_available(&this_01->super_byte_view,0x40);
  psVar8 = (short *)(this->m_view).super_byte_view.m_first;
  if (*psVar8 != 0x5a4d) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffe10,"Invalid DOS signature","");
    impl::throw_invalid((string *)&stack0xfffffffffffffe10);
  }
  uVar3 = *(uint *)(psVar8 + 0x1e);
  uVar33 = uVar3 + 0xf8;
  byte_view::check_available(&this_01->super_byte_view,uVar33);
  puVar34 = (this_01->super_byte_view).m_first;
  uVar2 = *(ushort *)(puVar34 + (ulong)uVar3 + 6);
  if ((ushort)(uVar2 - 0x65) < 0xff9c) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffe10,"Invalid PE section count","");
    impl::throw_invalid((string *)&stack0xfffffffffffffe10);
  }
  if (*(short *)(puVar34 + (ulong)uVar3 + 0x18) == 0x10b) {
    piVar21 = (int *)(puVar34 + (ulong)uVar3 + 0xe8);
    iVar40 = 0x120;
  }
  else {
    if (*(short *)(puVar34 + (ulong)uVar3 + 0x18) != 0x20b) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffe10,"Invalid optional header magic value","");
      impl::throw_invalid((string *)&stack0xfffffffffffffe10);
    }
    uVar33 = uVar3 + 0x108;
    byte_view::check_available(&this_01->super_byte_view,uVar33);
    piVar21 = (int *)((this_01->super_byte_view).m_first + (ulong)uVar3 + 0xf8);
    iVar40 = 0x130;
  }
  iVar39 = *piVar21;
  byte_view::check_available(&this_01->super_byte_view,uVar3 + iVar40);
  puVar34 = (this_01->super_byte_view).m_first + uVar33;
  piVar43 = (image_section_header *)(puVar34 + (ulong)uVar2 * 0x28);
  piVar22 = std::
            __find_if<winmd::impl::image_section_header_const*,__gnu_cxx::__ops::_Iter_pred<winmd::reader::database::section_from_rva(winmd::impl::image_section_header_const*,winmd::impl::image_section_header_const*,unsigned_int)::_lambda(auto:1&&)_1_>>
                      (puVar34,piVar43,iVar39);
  if (piVar22 == piVar43) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffe10,"PE section containing CLI header not found","");
    impl::throw_invalid((string *)&stack0xfffffffffffffe10);
  }
  iVar39 = iVar39 - piVar22->VirtualAddress;
  uVar41 = (ulong)(piVar22->PointerToRawData + iVar39);
  byte_view::check_available(&this_01->super_byte_view,piVar22->PointerToRawData + iVar39 + 0x48);
  puVar9 = (this_01->super_byte_view).m_first;
  if (*(int *)(puVar9 + uVar41) != 0x48) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffe10,"Invalid CLI header","");
    impl::throw_invalid((string *)&stack0xfffffffffffffe10);
  }
  iVar40 = *(int *)(puVar9 + uVar41 + 8);
  piVar22 = std::
            __find_if<winmd::impl::image_section_header_const*,__gnu_cxx::__ops::_Iter_pred<winmd::reader::database::section_from_rva(winmd::impl::image_section_header_const*,winmd::impl::image_section_header_const*,unsigned_int)::_lambda(auto:1&&)_1_>>
                      (puVar34,piVar43,iVar40);
  if (piVar22 == piVar43) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffe10,"PE section containing CLI metadata not found","")
    ;
    impl::throw_invalid((string *)&stack0xfffffffffffffe10);
  }
  iVar40 = iVar40 - piVar22->VirtualAddress;
  uVar3 = piVar22->PointerToRawData + iVar40;
  byte_view::check_available(&this_01->super_byte_view,piVar22->PointerToRawData + iVar40 + 4);
  if (*(int *)((this_01->super_byte_view).m_first + uVar3) != 0x424a5342) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffe10,"CLI metadata magic signature not found","");
    impl::throw_invalid((string *)&stack0xfffffffffffffe10);
  }
  byte_view::check_available(&this_01->super_byte_view,uVar3 + 0x10);
  iVar40 = *(int *)((this->m_view).super_byte_view.m_first + (uVar3 + 0xc));
  uVar33 = iVar40 + 0x14 + uVar3;
  byte_view::check_available(&this_01->super_byte_view,uVar33);
  sVar32 = *(short *)((this->m_view).super_byte_view.m_first + (iVar40 + uVar3 + 0x12));
  byte_view::check_available(&this_01->super_byte_view,uVar33);
  local_178.m_first = (this->m_view).super_byte_view.m_first + uVar33;
  local_178.m_last = (this->m_view).super_byte_view.m_last;
  tables.m_first = (uint8_t *)0x0;
  tables.m_last = (uint8_t *)0x0;
  do {
    if (sVar32 == 0) {
      byte_view::check_available(&tables,7);
      bVar1 = tables.m_first[6];
      byte_view::check_available(&tables,0x10);
      uVar41 = *(ulong *)(tables.m_first + 8);
      byte_view::check_available(&tables,0x18);
      local_178.m_first = tables.m_first + 0x18;
      local_178.m_last = tables.m_last;
      uVar35 = 0;
      do {
        if ((uVar41 >> (uVar35 & 0x3f) & 1) != 0) {
          byte_view::check_available(&local_178,4);
          uVar4 = *(uint32_t *)local_178.m_first;
          byte_view::check_available(&local_178,4);
          local_178.m_first = (uint8_t *)((long)local_178.m_first + 4);
          puVar24 = &(this->Module).super_table_base.m_row_count;
          switch(uVar35 & 0xffffffff) {
          case 0:
            break;
          case 1:
            puVar24 = &(this->TypeRef).super_table_base.m_row_count;
            break;
          case 2:
            puVar24 = &(this->TypeDef).super_table_base.m_row_count;
            break;
          default:
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&stack0xfffffffffffffe10,"Unknown metadata table","");
            impl::throw_invalid((string *)&stack0xfffffffffffffe10);
          case 4:
            puVar24 = &(this->Field).super_table_base.m_row_count;
            break;
          case 6:
            puVar24 = &(this->MethodDef).super_table_base.m_row_count;
            break;
          case 8:
            puVar24 = &(this->Param).super_table_base.m_row_count;
            break;
          case 9:
            puVar24 = &(this->InterfaceImpl).super_table_base.m_row_count;
            break;
          case 10:
            puVar24 = &(this->MemberRef).super_table_base.m_row_count;
            break;
          case 0xb:
            puVar24 = &(this->Constant).super_table_base.m_row_count;
            break;
          case 0xc:
            puVar24 = &(this->CustomAttribute).super_table_base.m_row_count;
            break;
          case 0xd:
            puVar24 = &(this->FieldMarshal).super_table_base.m_row_count;
            break;
          case 0xe:
            puVar24 = &(this->DeclSecurity).super_table_base.m_row_count;
            break;
          case 0xf:
            puVar24 = &(this->ClassLayout).super_table_base.m_row_count;
            break;
          case 0x10:
            puVar24 = &(this->FieldLayout).super_table_base.m_row_count;
            break;
          case 0x11:
            puVar24 = &(this->StandAloneSig).super_table_base.m_row_count;
            break;
          case 0x12:
            puVar24 = &(this->EventMap).super_table_base.m_row_count;
            break;
          case 0x14:
            puVar24 = &(this->Event).super_table_base.m_row_count;
            break;
          case 0x15:
            puVar24 = &(this->PropertyMap).super_table_base.m_row_count;
            break;
          case 0x17:
            puVar24 = &(this->Property).super_table_base.m_row_count;
            break;
          case 0x18:
            puVar24 = &(this->MethodSemantics).super_table_base.m_row_count;
            break;
          case 0x19:
            puVar24 = &(this->MethodImpl).super_table_base.m_row_count;
            break;
          case 0x1a:
            puVar24 = &(this->ModuleRef).super_table_base.m_row_count;
            break;
          case 0x1b:
            puVar24 = &(this->TypeSpec).super_table_base.m_row_count;
            break;
          case 0x1c:
            puVar24 = &(this->ImplMap).super_table_base.m_row_count;
            break;
          case 0x1d:
            puVar24 = &(this->FieldRVA).super_table_base.m_row_count;
            break;
          case 0x20:
            puVar24 = &(this->Assembly).super_table_base.m_row_count;
            break;
          case 0x21:
            puVar24 = &(this->AssemblyProcessor).super_table_base.m_row_count;
            break;
          case 0x22:
            puVar24 = &(this->AssemblyOS).super_table_base.m_row_count;
            break;
          case 0x23:
            puVar24 = &(this->AssemblyRef).super_table_base.m_row_count;
            break;
          case 0x24:
            puVar24 = &(this->AssemblyRefProcessor).super_table_base.m_row_count;
            break;
          case 0x25:
            puVar24 = &(this->AssemblyRefOS).super_table_base.m_row_count;
            break;
          case 0x26:
            puVar24 = &(this->File).super_table_base.m_row_count;
            break;
          case 0x27:
            puVar24 = &(this->ExportedType).super_table_base.m_row_count;
            break;
          case 0x28:
            puVar24 = &(this->ManifestResource).super_table_base.m_row_count;
            break;
          case 0x29:
            puVar24 = &(this->NestedClass).super_table_base.m_row_count;
            break;
          case 0x2a:
            puVar24 = &(this->GenericParam).super_table_base.m_row_count;
            break;
          case 0x2b:
            puVar24 = &(this->MethodSpec).super_table_base.m_row_count;
            break;
          case 0x2c:
            puVar24 = &(this->GenericParamConstraint).super_table_base.m_row_count;
          }
          *puVar24 = uVar4;
        }
        f = SUB81(in_stack_fffffffffffffe10._M_p,0);
        uVar35 = uVar35 + 1;
      } while (uVar35 != 0x40);
      cVar12 = (char)((bVar1 & 4) >> 2);
      uVar15 = cVar12 * '\x02' + '\x02';
      bVar37 = (bVar1 & 1) * '\x02';
      uVar25 = bVar37 + 2;
      this_00 = &this->TypeDef;
      bVar16 = 0x3fff < (this->TypeSpec).super_table_base.m_row_count ||
               (0x3fff < (this->TypeRef).super_table_base.m_row_count ||
               0x3fff < (this->TypeDef).super_table_base.m_row_count);
      uVar17 = bVar16 * '\x02' + '\x02';
      bVar38 = (0x3fff < (this->Property).super_table_base.m_row_count ||
               (0x3fff < (this->Param).super_table_base.m_row_count ||
               0x3fff < (this->Field).super_table_base.m_row_count)) * '\x02';
      this_02 = &this->MethodDef;
      this_03 = &this->Module;
      this_04 = &this->Assembly;
      this_05 = &this->AssemblyRef;
      uVar18 = composite_index_size<winmd::reader::table<winmd::reader::MethodDef>,winmd::reader::table<winmd::reader::Field>,winmd::reader::table<winmd::reader::TypeRef>,winmd::reader::table<winmd::reader::TypeDef>,winmd::reader::table<winmd::reader::Param>,winmd::reader::table<winmd::reader::InterfaceImpl>,winmd::reader::table<winmd::reader::MemberRef>,winmd::reader::table<winmd::reader::Module>,winmd::reader::table<winmd::reader::Property>,winmd::reader::table<winmd::reader::Event>,winmd::reader::table<winmd::reader::StandAloneSig>,winmd::reader::table<winmd::reader::ModuleRef>,winmd::reader::table<winmd::reader::TypeSpec>,winmd::reader::table<winmd::reader::Assembly>,winmd::reader::table<winmd::reader::AssemblyRef>,winmd::reader::table<winmd::reader::File>,winmd::reader::table<winmd::reader::ExportedType>,winmd::reader::table<winmd::reader::ManifestResource>,winmd::reader::table<winmd::reader::GenericParam>,winmd::reader::table<winmd::reader::GenericParamConstraint>,winmd::reader::table<winmd::reader::MethodSpec>>
                         (this_02,&this->Field,&this->TypeRef,this_00,&this->Param,
                          &this->InterfaceImpl,&this->MemberRef,this_03,&this->Property,&this->Event
                          ,&this->StandAloneSig,&this->ModuleRef,&this->TypeSpec,this_04,this_05,
                          &this->File,&this->ExportedType,&this->ManifestResource,
                          &this->GenericParam,&this->GenericParamConstraint,&this->MethodSpec);
      bVar44 = 0x7fff < (this->Field).super_table_base.m_row_count;
      uVar26 = (0x7fff < (this->Param).super_table_base.m_row_count || bVar44) * '\x02' + '\x02';
      uVar3 = (this->TypeDef).super_table_base.m_row_count;
      uVar33 = (this->MethodDef).super_table_base.m_row_count;
      bVar20 = (0x3fff < (this->Assembly).super_table_base.m_row_count ||
               (0x3fff < uVar33 || 0x3fff < uVar3)) * '\x02';
      uVar5 = (this->TypeRef).super_table_base.m_row_count;
      uVar6 = (this->ModuleRef).super_table_base.m_row_count;
      uVar27 = (0x1fff < (this->TypeSpec).super_table_base.m_row_count ||
               ((0x1fff < uVar6 || 0x1fff < uVar33) || (0x1fff < uVar5 || 0x1fff < uVar3))) * '\x02'
               + '\x02';
      uVar28 = (0x7fff < (this->Property).super_table_base.m_row_count ||
               0x7fff < (this->Event).super_table_base.m_row_count) * '\x02' + '\x02';
      bVar45 = 0x7fff < uVar33;
      uVar7 = (this->MemberRef).super_table_base.m_row_count;
      uVar29 = (0x7fff < uVar7 || bVar45) * '\x02' + '\x02';
      bVar10 = (bVar45 || bVar44) * '\x02';
      bVar46 = 0x3fff < (this->AssemblyRef).super_table_base.m_row_count;
      uVar19 = (0x3fff < (this->ExportedType).super_table_base.m_row_count ||
               (bVar46 || 0x3fff < (this->File).super_table_base.m_row_count)) * '\x02' + '\x02';
      bVar44 = 0x1fff < uVar7 || 0x1fff < uVar33;
      uVar30 = (0x3fff < uVar5 ||
               ((0x3fff < uVar6 || 0x3fff < (this->Module).super_table_base.m_row_count) || bVar46))
               * '\x02' + '\x02';
      cVar11 = (0x7fff < uVar3 || bVar45) * '\x02';
      d = (bVar1 & 1) * '\x02' + '\x02';
      c = cVar12 * '\x02' + '\x02';
      table_base::set_columns(&this_04->super_table_base,'\x04','\b','\x04',c,d,(uint8_t)f);
      ptVar13 = &(this->AssemblyOS).super_table_base;
      (this->AssemblyOS).super_table_base.m_row_size = '\f';
      (ptVar13->m_columns)._M_elems[0].offset = '\0';
      (ptVar13->m_columns)._M_elems[0].size = '\x04';
      (this->AssemblyOS).super_table_base.m_columns._M_elems[1].offset = '\x04';
      *(undefined2 *)&(this->AssemblyOS).super_table_base.m_columns._M_elems[1].size = 0x804;
      (this->AssemblyOS).super_table_base.m_columns._M_elems[2].size = '\x04';
      (this->AssemblyProcessor).super_table_base.m_row_size = '\x04';
      (this->AssemblyProcessor).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->AssemblyProcessor).super_table_base.m_columns._M_elems[0].size = '\x04';
      table_base::set_columns(&this_05->super_table_base,'\b','\x04',c,d,d,(uint8_t)f);
      cVar12 = (0xffff < (this->AssemblyRef).super_table_base.m_row_count) * '\x02';
      (this->AssemblyRefOS).super_table_base.m_row_size = cVar12 + '\x0e';
      ptVar13 = &(this->AssemblyRefOS).super_table_base;
      ptVar14 = &(this->AssemblyRefOS).super_table_base;
      (ptVar13->m_columns)._M_elems[0].offset = '\0';
      (ptVar13->m_columns)._M_elems[0].size = '\x04';
      (ptVar14->m_columns)._M_elems[1].offset = '\x04';
      (ptVar14->m_columns)._M_elems[1].size = '\x04';
      ptVar13 = &(this->AssemblyRefOS).super_table_base;
      (ptVar13->m_columns)._M_elems[2].offset = '\b';
      (ptVar13->m_columns)._M_elems[2].size = '\x04';
      (this->AssemblyRefOS).super_table_base.m_columns._M_elems[3].offset = '\f';
      (this->AssemblyRefOS).super_table_base.m_columns._M_elems[3].size = cVar12 + '\x02';
      (this->AssemblyRefProcessor).super_table_base.m_row_size = cVar12 + '\x06';
      (this->AssemblyRefProcessor).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->AssemblyRefProcessor).super_table_base.m_columns._M_elems[0].size = '\x04';
      (this->AssemblyRefProcessor).super_table_base.m_columns._M_elems[1].offset = '\x04';
      (this->AssemblyRefProcessor).super_table_base.m_columns._M_elems[1].size = cVar12 + '\x02';
      bVar31 = (0xffff < (this->TypeDef).super_table_base.m_row_count) * '\x02';
      uVar42 = bVar31 + 2;
      (this->ClassLayout).super_table_base.m_row_size = bVar31 | 8;
      ptVar13 = &(this->ClassLayout).super_table_base;
      ptVar14 = &(this->ClassLayout).super_table_base;
      (ptVar13->m_columns)._M_elems[0].offset = '\0';
      (ptVar13->m_columns)._M_elems[0].size = '\x02';
      (ptVar14->m_columns)._M_elems[1].offset = '\x02';
      (ptVar14->m_columns)._M_elems[1].size = '\x04';
      (this->ClassLayout).super_table_base.m_columns._M_elems[2].offset = '\x06';
      (this->ClassLayout).super_table_base.m_columns._M_elems[2].size = uVar42;
      bVar31 = bVar38 | 4;
      (this->Constant).super_table_base.m_row_size = bVar31 + uVar15;
      (this->Constant).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->Constant).super_table_base.m_columns._M_elems[0].size = '\x02';
      (this->Constant).super_table_base.m_columns._M_elems[1].offset = '\x02';
      (this->Constant).super_table_base.m_columns._M_elems[1].size = bVar38 + 2;
      (this->Constant).super_table_base.m_columns._M_elems[2].offset = bVar31;
      (this->Constant).super_table_base.m_columns._M_elems[2].size = uVar15;
      uVar36 = uVar18 + bVar44 * '\x02' + '\x02';
      (this->CustomAttribute).super_table_base.m_row_size = uVar15 + uVar36;
      (this->CustomAttribute).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->CustomAttribute).super_table_base.m_columns._M_elems[0].size = uVar18;
      (this->CustomAttribute).super_table_base.m_columns._M_elems[1].offset = uVar18;
      (this->CustomAttribute).super_table_base.m_columns._M_elems[1].size = bVar44 * '\x02' + '\x02'
      ;
      (this->CustomAttribute).super_table_base.m_columns._M_elems[2].offset = uVar36;
      (this->CustomAttribute).super_table_base.m_columns._M_elems[2].size = uVar15;
      bVar38 = bVar20 | 4;
      (this->DeclSecurity).super_table_base.m_row_size = bVar38 + uVar15;
      (this->DeclSecurity).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->DeclSecurity).super_table_base.m_columns._M_elems[0].size = '\x02';
      (this->DeclSecurity).super_table_base.m_columns._M_elems[1].offset = '\x02';
      (this->DeclSecurity).super_table_base.m_columns._M_elems[1].size = bVar20 + 2;
      (this->DeclSecurity).super_table_base.m_columns._M_elems[2].offset = bVar38;
      (this->DeclSecurity).super_table_base.m_columns._M_elems[2].size = uVar15;
      uVar18 = (0xffff < (this->Event).super_table_base.m_row_count) * '\x02' + '\x02';
      (this->EventMap).super_table_base.m_row_size = uVar18 + uVar42;
      (this->EventMap).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->EventMap).super_table_base.m_columns._M_elems[0].size = uVar42;
      (this->EventMap).super_table_base.m_columns._M_elems[1].offset = uVar42;
      (this->EventMap).super_table_base.m_columns._M_elems[1].size = uVar18;
      bVar38 = bVar37 | 4;
      (this->Event).super_table_base.m_row_size = uVar17 + bVar38;
      (this->Event).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->Event).super_table_base.m_columns._M_elems[0].size = '\x02';
      (this->Event).super_table_base.m_columns._M_elems[1].offset = '\x02';
      (this->Event).super_table_base.m_columns._M_elems[1].size = uVar25;
      (this->Event).super_table_base.m_columns._M_elems[2].offset = bVar37 | 4;
      (this->Event).super_table_base.m_columns._M_elems[2].size = uVar17;
      uVar18 = bVar37 + 10;
      (this->ExportedType).super_table_base.m_row_size = uVar19 + uVar25 + uVar18;
      ptVar13 = &(this->ExportedType).super_table_base;
      ptVar14 = &(this->ExportedType).super_table_base;
      (ptVar13->m_columns)._M_elems[0].offset = '\0';
      (ptVar13->m_columns)._M_elems[0].size = '\x04';
      (ptVar14->m_columns)._M_elems[1].offset = '\x04';
      (ptVar14->m_columns)._M_elems[1].size = '\x04';
      (this->ExportedType).super_table_base.m_columns._M_elems[2].offset = '\b';
      (this->ExportedType).super_table_base.m_columns._M_elems[2].size = uVar25;
      (this->ExportedType).super_table_base.m_columns._M_elems[3].offset = uVar18;
      (this->ExportedType).super_table_base.m_columns._M_elems[3].size = uVar25;
      (this->ExportedType).super_table_base.m_columns._M_elems[4].offset = uVar25 + uVar18;
      (this->ExportedType).super_table_base.m_columns._M_elems[4].size = uVar19;
      (this->Field).super_table_base.m_row_size = uVar15 + bVar38;
      (this->Field).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->Field).super_table_base.m_columns._M_elems[0].size = '\x02';
      (this->Field).super_table_base.m_columns._M_elems[1].offset = '\x02';
      (this->Field).super_table_base.m_columns._M_elems[1].size = uVar25;
      (this->Field).super_table_base.m_columns._M_elems[2].offset = bVar37 | 4;
      (this->Field).super_table_base.m_columns._M_elems[2].size = uVar15;
      cVar12 = (0xffff < (this->Field).super_table_base.m_row_count) * '\x02';
      uVar42 = cVar12 + '\x02';
      uVar36 = cVar12 + '\x06';
      (this->FieldLayout).super_table_base.m_row_size = uVar36;
      (this->FieldLayout).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->FieldLayout).super_table_base.m_columns._M_elems[0].size = '\x04';
      (this->FieldLayout).super_table_base.m_columns._M_elems[1].offset = '\x04';
      (this->FieldLayout).super_table_base.m_columns._M_elems[1].size = uVar42;
      (this->FieldMarshal).super_table_base.m_row_size = uVar15 + uVar26;
      (this->FieldMarshal).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->FieldMarshal).super_table_base.m_columns._M_elems[0].size = uVar26;
      (this->FieldMarshal).super_table_base.m_columns._M_elems[1].offset = uVar26;
      (this->FieldMarshal).super_table_base.m_columns._M_elems[1].size = uVar15;
      (this->FieldRVA).super_table_base.m_row_size = uVar36;
      (this->FieldRVA).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->FieldRVA).super_table_base.m_columns._M_elems[0].size = '\x04';
      (this->FieldRVA).super_table_base.m_columns._M_elems[1].offset = '\x04';
      (this->FieldRVA).super_table_base.m_columns._M_elems[1].size = uVar42;
      uVar36 = bVar37 + 6;
      (this->File).super_table_base.m_row_size = uVar15 + uVar36;
      (this->File).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->File).super_table_base.m_columns._M_elems[0].size = '\x04';
      (this->File).super_table_base.m_columns._M_elems[1].offset = '\x04';
      (this->File).super_table_base.m_columns._M_elems[1].size = uVar25;
      (this->File).super_table_base.m_columns._M_elems[2].offset = uVar36;
      (this->File).super_table_base.m_columns._M_elems[2].size = uVar15;
      uVar42 = cVar11 + '\x06';
      (this->GenericParam).super_table_base.m_row_size = uVar42 + uVar25;
      ptVar13 = &(this->GenericParam).super_table_base;
      ptVar14 = &(this->GenericParam).super_table_base;
      (ptVar13->m_columns)._M_elems[0].offset = '\0';
      (ptVar13->m_columns)._M_elems[0].size = '\x02';
      (ptVar14->m_columns)._M_elems[1].offset = '\x02';
      (ptVar14->m_columns)._M_elems[1].size = '\x02';
      (this->GenericParam).super_table_base.m_columns._M_elems[2].offset = '\x04';
      (this->GenericParam).super_table_base.m_columns._M_elems[2].size = cVar11 + '\x02';
      (this->GenericParam).super_table_base.m_columns._M_elems[3].offset = uVar42;
      (this->GenericParam).super_table_base.m_columns._M_elems[3].size = uVar25;
      uVar42 = (0xffff < (this->GenericParam).super_table_base.m_row_count) * '\x02' + '\x02';
      (this->GenericParamConstraint).super_table_base.m_row_size = uVar42 + uVar17;
      (this->GenericParamConstraint).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->GenericParamConstraint).super_table_base.m_columns._M_elems[0].size = uVar42;
      (this->GenericParamConstraint).super_table_base.m_columns._M_elems[1].offset = uVar42;
      (this->GenericParamConstraint).super_table_base.m_columns._M_elems[1].size = uVar17;
      uVar26 = (0xffff < (this->ModuleRef).super_table_base.m_row_count) * '\x02' + '\x02';
      bVar37 = bVar10 | 4;
      uVar42 = bVar37 + uVar25;
      (this->ImplMap).super_table_base.m_row_size = uVar26 + uVar42;
      (this->ImplMap).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->ImplMap).super_table_base.m_columns._M_elems[0].size = '\x02';
      (this->ImplMap).super_table_base.m_columns._M_elems[1].offset = '\x02';
      (this->ImplMap).super_table_base.m_columns._M_elems[1].size = bVar10 + 2;
      (this->ImplMap).super_table_base.m_columns._M_elems[2].offset = bVar37;
      (this->ImplMap).super_table_base.m_columns._M_elems[2].size = uVar25;
      (this->ImplMap).super_table_base.m_columns._M_elems[3].offset = uVar42;
      (this->ImplMap).super_table_base.m_columns._M_elems[3].size = uVar26;
      uVar42 = (0xffff < (this->TypeDef).super_table_base.m_row_count) * '\x02' + '\x02';
      (this->InterfaceImpl).super_table_base.m_row_size = uVar42 + uVar17;
      (this->InterfaceImpl).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->InterfaceImpl).super_table_base.m_columns._M_elems[0].size = uVar42;
      (this->InterfaceImpl).super_table_base.m_columns._M_elems[1].offset = uVar42;
      (this->InterfaceImpl).super_table_base.m_columns._M_elems[1].size = uVar17;
      (this->ManifestResource).super_table_base.m_row_size = uVar19 + uVar18;
      ptVar13 = &(this->ManifestResource).super_table_base;
      ptVar14 = &(this->ManifestResource).super_table_base;
      (ptVar13->m_columns)._M_elems[0].offset = '\0';
      (ptVar13->m_columns)._M_elems[0].size = '\x04';
      (ptVar14->m_columns)._M_elems[1].offset = '\x04';
      (ptVar14->m_columns)._M_elems[1].size = '\x04';
      (this->ManifestResource).super_table_base.m_columns._M_elems[2].offset = '\b';
      (this->ManifestResource).super_table_base.m_columns._M_elems[2].size = uVar25;
      (this->ManifestResource).super_table_base.m_columns._M_elems[3].offset = uVar18;
      (this->ManifestResource).super_table_base.m_columns._M_elems[3].size = uVar19;
      (this->MemberRef).super_table_base.m_row_size = uVar27 + uVar25 + uVar15;
      (this->MemberRef).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->MemberRef).super_table_base.m_columns._M_elems[0].size = uVar27;
      (this->MemberRef).super_table_base.m_columns._M_elems[1].offset = uVar27;
      (this->MemberRef).super_table_base.m_columns._M_elems[1].size = uVar25;
      (this->MemberRef).super_table_base.m_columns._M_elems[2].offset = uVar27 + uVar25;
      (this->MemberRef).super_table_base.m_columns._M_elems[2].size = uVar15;
      table_base::set_columns(&this_02->super_table_base,'\x04','\x02','\x02',d,c,(uint8_t)f);
      uVar3 = (this->MethodDef).super_table_base.m_row_count;
      uVar42 = (0xffff < (this->TypeDef).super_table_base.m_row_count) * '\x02' + '\x02';
      (this->MethodImpl).super_table_base.m_row_size = uVar42 + uVar29 + uVar29;
      (this->MethodImpl).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->MethodImpl).super_table_base.m_columns._M_elems[0].size = uVar42;
      (this->MethodImpl).super_table_base.m_columns._M_elems[1].offset = uVar42;
      (this->MethodImpl).super_table_base.m_columns._M_elems[1].size = uVar29;
      (this->MethodImpl).super_table_base.m_columns._M_elems[2].offset = uVar42 + uVar29;
      (this->MethodImpl).super_table_base.m_columns._M_elems[2].size = uVar29;
      bVar37 = (0xffff < uVar3) * '\x02';
      bVar20 = bVar37 | 4;
      (this->MethodSemantics).super_table_base.m_row_size = bVar20 + uVar28;
      (this->MethodSemantics).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->MethodSemantics).super_table_base.m_columns._M_elems[0].size = '\x02';
      (this->MethodSemantics).super_table_base.m_columns._M_elems[1].offset = '\x02';
      (this->MethodSemantics).super_table_base.m_columns._M_elems[1].size = bVar37 + 2;
      (this->MethodSemantics).super_table_base.m_columns._M_elems[2].offset = bVar20;
      (this->MethodSemantics).super_table_base.m_columns._M_elems[2].size = uVar28;
      (this->MethodSpec).super_table_base.m_row_size = uVar29 + uVar15;
      (this->MethodSpec).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->MethodSpec).super_table_base.m_columns._M_elems[0].size = uVar29;
      (this->MethodSpec).super_table_base.m_columns._M_elems[1].offset = uVar29;
      (this->MethodSpec).super_table_base.m_columns._M_elems[1].size = uVar15;
      uVar42 = (bVar1 & 2) + 2;
      table_base::set_columns(&this_03->super_table_base,'\x02',d,uVar42,uVar42,uVar42,(uint8_t)f);
      (this->ModuleRef).super_table_base.m_row_size = uVar25;
      (this->ModuleRef).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->ModuleRef).super_table_base.m_columns._M_elems[0].size = uVar25;
      uVar42 = (0xffff < (this->TypeDef).super_table_base.m_row_count) * '\x02' + '\x02';
      (this->NestedClass).super_table_base.m_row_size = uVar42 * '\x02';
      (this->NestedClass).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->NestedClass).super_table_base.m_columns._M_elems[0].size = uVar42;
      (this->NestedClass).super_table_base.m_columns._M_elems[1].offset = uVar42;
      (this->NestedClass).super_table_base.m_columns._M_elems[1].size = uVar42;
      (this->Param).super_table_base.m_row_size = uVar36;
      ptVar13 = &(this->Param).super_table_base;
      ptVar14 = &(this->Param).super_table_base;
      (ptVar13->m_columns)._M_elems[0].offset = '\0';
      (ptVar13->m_columns)._M_elems[0].size = '\x02';
      (ptVar14->m_columns)._M_elems[1].offset = '\x02';
      (ptVar14->m_columns)._M_elems[1].size = '\x02';
      (this->Param).super_table_base.m_columns._M_elems[2].offset = '\x04';
      (this->Param).super_table_base.m_columns._M_elems[2].size = uVar25;
      (this->Property).super_table_base.m_row_size = uVar15 + bVar38;
      (this->Property).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->Property).super_table_base.m_columns._M_elems[0].size = '\x02';
      (this->Property).super_table_base.m_columns._M_elems[1].offset = '\x02';
      (this->Property).super_table_base.m_columns._M_elems[1].size = uVar25;
      (this->Property).super_table_base.m_columns._M_elems[2].offset = bVar38;
      (this->Property).super_table_base.m_columns._M_elems[2].size = uVar15;
      uVar18 = (0xffff < (this->Property).super_table_base.m_row_count) * '\x02' + '\x02';
      (this->PropertyMap).super_table_base.m_row_size = uVar18 + uVar42;
      (this->PropertyMap).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->PropertyMap).super_table_base.m_columns._M_elems[0].size = uVar42;
      (this->PropertyMap).super_table_base.m_columns._M_elems[1].offset = uVar42;
      (this->PropertyMap).super_table_base.m_columns._M_elems[1].size = uVar18;
      (this->StandAloneSig).super_table_base.m_row_size = uVar15;
      (this->StandAloneSig).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->StandAloneSig).super_table_base.m_columns._M_elems[0].size = uVar15;
      table_base::set_columns
                (&this_00->super_table_base,'\x04',d,d,bVar16 * '\x02' + '\x02',
                 (0xffff < (this->Field).super_table_base.m_row_count) * '\x02' + '\x02',(uint8_t)f)
      ;
      (this->TypeRef).super_table_base.m_row_size = uVar30 + uVar25 + uVar25;
      (this->TypeRef).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->TypeRef).super_table_base.m_columns._M_elems[0].size = uVar30;
      (this->TypeRef).super_table_base.m_columns._M_elems[1].offset = uVar30;
      (this->TypeRef).super_table_base.m_columns._M_elems[1].size = uVar25;
      (this->TypeRef).super_table_base.m_columns._M_elems[2].offset = uVar30 + uVar25;
      (this->TypeRef).super_table_base.m_columns._M_elems[2].size = uVar25;
      (this->TypeSpec).super_table_base.m_row_size = uVar15;
      (this->TypeSpec).super_table_base.m_columns._M_elems[0].offset = '\0';
      (this->TypeSpec).super_table_base.m_columns._M_elems[0].size = uVar15;
      table_base::set_data(&this_03->super_table_base,&local_178);
      table_base::set_data((table_base *)this,&local_178);
      table_base::set_data(&this_00->super_table_base,&local_178);
      table_base::set_data(&(this->Field).super_table_base,&local_178);
      table_base::set_data(&this_02->super_table_base,&local_178);
      table_base::set_data(&(this->Param).super_table_base,&local_178);
      table_base::set_data(&(this->InterfaceImpl).super_table_base,&local_178);
      table_base::set_data(&(this->MemberRef).super_table_base,&local_178);
      table_base::set_data(&(this->Constant).super_table_base,&local_178);
      table_base::set_data(&(this->CustomAttribute).super_table_base,&local_178);
      table_base::set_data(&(this->FieldMarshal).super_table_base,&local_178);
      table_base::set_data(&(this->DeclSecurity).super_table_base,&local_178);
      table_base::set_data(&(this->ClassLayout).super_table_base,&local_178);
      table_base::set_data(&(this->FieldLayout).super_table_base,&local_178);
      table_base::set_data(&(this->StandAloneSig).super_table_base,&local_178);
      table_base::set_data(&(this->EventMap).super_table_base,&local_178);
      table_base::set_data(&(this->Event).super_table_base,&local_178);
      table_base::set_data(&(this->PropertyMap).super_table_base,&local_178);
      table_base::set_data(&(this->Property).super_table_base,&local_178);
      table_base::set_data(&(this->MethodSemantics).super_table_base,&local_178);
      table_base::set_data(&(this->MethodImpl).super_table_base,&local_178);
      table_base::set_data(&(this->ModuleRef).super_table_base,&local_178);
      table_base::set_data(&(this->TypeSpec).super_table_base,&local_178);
      table_base::set_data(&(this->ImplMap).super_table_base,&local_178);
      table_base::set_data(&(this->FieldRVA).super_table_base,&local_178);
      table_base::set_data(&this_04->super_table_base,&local_178);
      table_base::set_data(&(this->AssemblyProcessor).super_table_base,&local_178);
      table_base::set_data(&(this->AssemblyOS).super_table_base,&local_178);
      table_base::set_data(&this_05->super_table_base,&local_178);
      table_base::set_data(&(this->AssemblyRefProcessor).super_table_base,&local_178);
      table_base::set_data(&(this->AssemblyRefOS).super_table_base,&local_178);
      table_base::set_data(&(this->File).super_table_base,&local_178);
      table_base::set_data(&(this->ExportedType).super_table_base,&local_178);
      table_base::set_data(&(this->ManifestResource).super_table_base,&local_178);
      table_base::set_data(&(this->NestedClass).super_table_base,&local_178);
      table_base::set_data(&(this->GenericParam).super_table_base,&local_178);
      table_base::set_data(&(this->MethodSpec).super_table_base,&local_178);
      table_base::set_data(&(this->GenericParamConstraint).super_table_base,&local_178);
      return;
    }
    byte_view::check_available(&local_178,8);
    iVar40 = *(int *)local_178.m_first;
    uVar33 = *(uint *)((long)local_178.m_first + 4);
    byte_view::check_available(&local_178,0x14);
    name._M_elems._0_8_ = *(undefined8 *)((long)local_178.m_first + 8);
    name._M_elems._8_4_ = *(int *)((long)local_178.m_first + 0x10);
    sVar23 = strlen(name._M_elems);
    if ((sVar23 == 8) && (iVar39 = bcmp(&name,"#Strings",8), iVar39 == 0)) {
      byte_view::check_available(&this_01->super_byte_view,uVar33 + iVar40 + uVar3);
      puVar34 = (this->m_view).super_byte_view.m_first + (iVar40 + uVar3);
      (this->m_strings).m_first = puVar34;
      (this->m_strings).m_last = puVar34 + uVar33;
    }
    else if (sVar23 == 5) {
      iVar39 = bcmp(&name,"#Blob",5);
      if (iVar39 == 0) {
        byte_view::check_available(&this_01->super_byte_view,uVar33 + iVar40 + uVar3);
        puVar34 = (this->m_view).super_byte_view.m_first + (iVar40 + uVar3);
        (this->m_blobs).m_first = puVar34;
        (this->m_blobs).m_last = puVar34 + uVar33;
      }
      else {
        iVar39 = bcmp(&name,"#GUID",5);
        if (iVar39 != 0) goto LAB_00165277;
        byte_view::check_available(&this_01->super_byte_view,uVar33 + iVar40 + uVar3);
        puVar34 = (this->m_view).super_byte_view.m_first + (iVar40 + uVar3);
        (this->m_guids).m_first = puVar34;
        (this->m_guids).m_last = puVar34 + uVar33;
      }
    }
    else {
LAB_00165277:
      if (sVar23 == 3) {
        iVar40 = bcmp(&name,"#US",3);
        if (iVar40 != 0) {
LAB_0016677e:
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffffe10,"Unknown metadata stream","");
          impl::throw_invalid((string *)&stack0xfffffffffffffe10);
        }
      }
      else {
        if ((sVar23 != 2) || (iVar39 = bcmp(&name,"#~",2), iVar39 != 0)) goto LAB_0016677e;
        byte_view::check_available(&this_01->super_byte_view,uVar33 + iVar40 + uVar3);
        tables.m_first = (this_01->super_byte_view).m_first + (iVar40 + uVar3);
        tables.m_last = tables.m_first + uVar33;
      }
    }
    uVar33 = ((uint)sVar23 & 0xfffffffc) + 0xc;
    byte_view::check_available(&local_178,uVar33);
    local_178.m_first = (uint8_t *)((long)local_178.m_first + (ulong)uVar33);
    sVar32 = sVar32 + -1;
  } while( true );
}

Assistant:

void initialize()
        {
            auto dos = m_view.as<impl::image_dos_header>();

            if (dos.e_signature != 0x5A4D) // IMAGE_DOS_SIGNATURE
            {
                impl::throw_invalid("Invalid DOS signature");
            }

            auto pe = m_view.as<impl::image_nt_headers32>(dos.e_lfanew);

            if (pe.FileHeader.NumberOfSections == 0 || pe.FileHeader.NumberOfSections > 100)
            {
                impl::throw_invalid("Invalid PE section count");
            }

            impl::image_section_header const* sections{};
            uint32_t com_virtual_address{};
            if (pe.OptionalHeader.Magic == 0x10B) // PE32
            {
                com_virtual_address = pe.OptionalHeader.DataDirectory[14].VirtualAddress; // IMAGE_DIRECTORY_ENTRY_COM_DESCRIPTOR
                sections = &m_view.as<impl::image_section_header>(dos.e_lfanew + sizeof(impl::image_nt_headers32));
            }
            else if (pe.OptionalHeader.Magic == 0x20B) // PE32+
            {
                auto pe_plus = m_view.as<impl::image_nt_headers32plus>(dos.e_lfanew);
                com_virtual_address = pe_plus.OptionalHeader.DataDirectory[14].VirtualAddress; // IMAGE_DIRECTORY_ENTRY_COM_DESCRIPTOR
                sections = &m_view.as<impl::image_section_header>(dos.e_lfanew + sizeof(impl::image_nt_headers32plus));
            }
            else
            {
                impl::throw_invalid("Invalid optional header magic value");
            }
            auto sections_end = sections + pe.FileHeader.NumberOfSections;
            auto section = section_from_rva(sections, sections_end, com_virtual_address);

            if (section == sections_end)
            {
                impl::throw_invalid("PE section containing CLI header not found");
            }

            auto offset = offset_from_rva(*section, com_virtual_address);

            auto cli = m_view.as<impl::image_cor20_header>(offset);

            if (cli.cb != sizeof(impl::image_cor20_header))
            {
                impl::throw_invalid("Invalid CLI header");
            }

            section = section_from_rva(sections, sections_end, cli.MetaData.VirtualAddress);

            if (section == sections_end)
            {
                impl::throw_invalid("PE section containing CLI metadata not found");
            }

            offset = offset_from_rva(*section, cli.MetaData.VirtualAddress);

            if (m_view.as<uint32_t>(offset) != 0x424a5342)
            {
                impl::throw_invalid("CLI metadata magic signature not found");
            }

            auto version_length = m_view.as<uint32_t>(offset + 12);
            auto stream_count = m_view.as<uint16_t>(offset + version_length + 18);
            auto view = m_view.seek(offset + version_length + 20);
            byte_view tables;

            for (uint16_t i{}; i < stream_count; ++i)
            {
                auto stream = view.as<stream_range>();
                auto name = view.as<std::array<char, 12>>(8);

                if (name.data() == "#Strings"sv)
                {
                    m_strings = m_view.sub(offset + stream.offset, stream.size);
                }
                else if (name.data() == "#Blob"sv)
                {
                    m_blobs = m_view.sub(offset + stream.offset, stream.size);
                }
                else if (name.data() == "#GUID"sv)
                {
                    m_guids = m_view.sub(offset + stream.offset, stream.size);
                }
                else if (name.data() == "#~"sv)
                {
                    tables = m_view.sub(offset + stream.offset, stream.size);
                }
                else if (name.data() != "#US"sv)
                {
                    impl::throw_invalid("Unknown metadata stream");
                }

                view = view.seek(stream_offset(name.data()));
            }

            std::bitset<8> const heap_sizes{ tables.as<uint8_t>(6) };
            uint8_t const string_index_size = heap_sizes.test(0) ? 4 : 2;
            uint8_t const guid_index_size = heap_sizes.test(1) ? 4 : 2;
            uint8_t const blob_index_size = heap_sizes.test(2) ? 4 : 2;

            std::bitset<64> const valid_bits{ tables.as<uint64_t>(8) };
            view = tables.seek(24);

            for (uint32_t i{}; i < 64; ++i)
            {
                if (!valid_bits.test(i))
                {
                    continue;
                }

                auto row_count = view.as<uint32_t>();
                view = view.seek(4);

                switch (i)
                {
                case 0x00: Module.set_row_count(row_count); break;
                case 0x01: TypeRef.set_row_count(row_count); break;
                case 0x02: TypeDef.set_row_count(row_count); break;
                case 0x04: Field.set_row_count(row_count); break;
                case 0x06: MethodDef.set_row_count(row_count); break;
                case 0x08: Param.set_row_count(row_count); break;
                case 0x09: InterfaceImpl.set_row_count(row_count); break;
                case 0x0a: MemberRef.set_row_count(row_count); break;
                case 0x0b: Constant.set_row_count(row_count); break;
                case 0x0c: CustomAttribute.set_row_count(row_count); break;
                case 0x0d: FieldMarshal.set_row_count(row_count); break;
                case 0x0e: DeclSecurity.set_row_count(row_count); break;
                case 0x0f: ClassLayout.set_row_count(row_count); break;
                case 0x10: FieldLayout.set_row_count(row_count); break;
                case 0x11: StandAloneSig.set_row_count(row_count); break;
                case 0x12: EventMap.set_row_count(row_count); break;
                case 0x14: Event.set_row_count(row_count); break;
                case 0x15: PropertyMap.set_row_count(row_count); break;
                case 0x17: Property.set_row_count(row_count); break;
                case 0x18: MethodSemantics.set_row_count(row_count); break;
                case 0x19: MethodImpl.set_row_count(row_count); break;
                case 0x1a: ModuleRef.set_row_count(row_count); break;
                case 0x1b: TypeSpec.set_row_count(row_count); break;
                case 0x1c: ImplMap.set_row_count(row_count); break;
                case 0x1d: FieldRVA.set_row_count(row_count); break;
                case 0x20: Assembly.set_row_count(row_count); break;
                case 0x21: AssemblyProcessor.set_row_count(row_count); break;
                case 0x22: AssemblyOS.set_row_count(row_count); break;
                case 0x23: AssemblyRef.set_row_count(row_count); break;
                case 0x24: AssemblyRefProcessor.set_row_count(row_count); break;
                case 0x25: AssemblyRefOS.set_row_count(row_count); break;
                case 0x26: File.set_row_count(row_count); break;
                case 0x27: ExportedType.set_row_count(row_count); break;
                case 0x28: ManifestResource.set_row_count(row_count); break;
                case 0x29: NestedClass.set_row_count(row_count); break;
                case 0x2a: GenericParam.set_row_count(row_count); break;
                case 0x2b: MethodSpec.set_row_count(row_count); break;
                case 0x2c: GenericParamConstraint.set_row_count(row_count); break;
                default: impl::throw_invalid("Unknown metadata table");
                };
            }

            table_base const empty_table{ nullptr };

            auto const TypeDefOrRef = composite_index_size(TypeDef, TypeRef, TypeSpec);
            auto const HasConstant = composite_index_size(Field, Param, Property);
            auto const HasCustomAttribute = composite_index_size(MethodDef, Field, TypeRef, TypeDef, Param, InterfaceImpl, MemberRef, Module, Property, Event, StandAloneSig, ModuleRef, TypeSpec, Assembly, AssemblyRef, File, ExportedType, ManifestResource, GenericParam, GenericParamConstraint, MethodSpec);
            auto const HasFieldMarshal = composite_index_size(Field, Param);
            auto const HasDeclSecurity = composite_index_size(TypeDef, MethodDef, Assembly);
            auto const MemberRefParent = composite_index_size(TypeDef, TypeRef, ModuleRef, MethodDef, TypeSpec);
            auto const HasSemantics = composite_index_size(Event, Property);
            auto const MethodDefOrRef = composite_index_size(MethodDef, MemberRef);
            auto const MemberForwarded = composite_index_size(Field, MethodDef);
            auto const Implementation = composite_index_size(File, AssemblyRef, ExportedType);
            auto const CustomAttributeType = composite_index_size(MethodDef, MemberRef, empty_table, empty_table, empty_table);
            auto const ResolutionScope = composite_index_size(Module, ModuleRef, AssemblyRef, TypeRef);
            auto const TypeOrMethodDef = composite_index_size(TypeDef, MethodDef);

            Assembly.set_columns(4, 8, 4, blob_index_size, string_index_size, string_index_size);
            AssemblyOS.set_columns(4, 4, 4);
            AssemblyProcessor.set_columns(4);
            AssemblyRef.set_columns(8, 4, blob_index_size, string_index_size, string_index_size, blob_index_size);
            AssemblyRefOS.set_columns(4, 4, 4, AssemblyRef.index_size());
            AssemblyRefProcessor.set_columns(4, AssemblyRef.index_size());
            ClassLayout.set_columns(2, 4, TypeDef.index_size());
            Constant.set_columns(2, HasConstant, blob_index_size);
            CustomAttribute.set_columns(HasCustomAttribute, CustomAttributeType, blob_index_size);
            DeclSecurity.set_columns(2, HasDeclSecurity, blob_index_size);
            EventMap.set_columns(TypeDef.index_size(), Event.index_size());
            Event.set_columns(2, string_index_size, TypeDefOrRef);
            ExportedType.set_columns(4, 4, string_index_size, string_index_size, Implementation);
            Field.set_columns(2, string_index_size, blob_index_size);
            FieldLayout.set_columns(4, Field.index_size());
            FieldMarshal.set_columns(HasFieldMarshal, blob_index_size);
            FieldRVA.set_columns(4, Field.index_size());
            File.set_columns(4, string_index_size, blob_index_size);
            GenericParam.set_columns(2, 2, TypeOrMethodDef, string_index_size);
            GenericParamConstraint.set_columns(GenericParam.index_size(), TypeDefOrRef);
            ImplMap.set_columns(2, MemberForwarded, string_index_size, ModuleRef.index_size());
            InterfaceImpl.set_columns(TypeDef.index_size(), TypeDefOrRef);
            ManifestResource.set_columns(4, 4, string_index_size, Implementation);
            MemberRef.set_columns(MemberRefParent, string_index_size, blob_index_size);
            MethodDef.set_columns(4, 2, 2, string_index_size, blob_index_size, Param.index_size());
            MethodImpl.set_columns(TypeDef.index_size(), MethodDefOrRef, MethodDefOrRef);
            MethodSemantics.set_columns(2, MethodDef.index_size(), HasSemantics);
            MethodSpec.set_columns(MethodDefOrRef, blob_index_size);
            Module.set_columns(2, string_index_size, guid_index_size, guid_index_size, guid_index_size);
            ModuleRef.set_columns(string_index_size);
            NestedClass.set_columns(TypeDef.index_size(), TypeDef.index_size());
            Param.set_columns(2, 2, string_index_size);
            Property.set_columns(2, string_index_size, blob_index_size);
            PropertyMap.set_columns(TypeDef.index_size(), Property.index_size());
            StandAloneSig.set_columns(blob_index_size);
            TypeDef.set_columns(4, string_index_size, string_index_size, TypeDefOrRef, Field.index_size(), MethodDef.index_size());
            TypeRef.set_columns(ResolutionScope, string_index_size, string_index_size);
            TypeSpec.set_columns(blob_index_size);

            Module.set_data(view);
            TypeRef.set_data(view);
            TypeDef.set_data(view);
            Field.set_data(view);
            MethodDef.set_data(view);
            Param.set_data(view);
            InterfaceImpl.set_data(view);
            MemberRef.set_data(view);
            Constant.set_data(view);
            CustomAttribute.set_data(view);
            FieldMarshal.set_data(view);
            DeclSecurity.set_data(view);
            ClassLayout.set_data(view);
            FieldLayout.set_data(view);
            StandAloneSig.set_data(view);
            EventMap.set_data(view);
            Event.set_data(view);
            PropertyMap.set_data(view);
            Property.set_data(view);
            MethodSemantics.set_data(view);
            MethodImpl.set_data(view);
            ModuleRef.set_data(view);
            TypeSpec.set_data(view);
            ImplMap.set_data(view);
            FieldRVA.set_data(view);
            Assembly.set_data(view);
            AssemblyProcessor.set_data(view);
            AssemblyOS.set_data(view);
            AssemblyRef.set_data(view);
            AssemblyRefProcessor.set_data(view);
            AssemblyRefOS.set_data(view);
            File.set_data(view);
            ExportedType.set_data(view);
            ManifestResource.set_data(view);
            NestedClass.set_data(view);
            GenericParam.set_data(view);
            MethodSpec.set_data(view);
            GenericParamConstraint.set_data(view);
        }